

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall StateScene::draw(StateScene *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  int *piVar6;
  reference pvVar7;
  int iVar8;
  string local_ac0;
  stringstream local_aa0 [8];
  stringstream countString;
  ostream local_a90 [376];
  string local_918;
  stringstream local_8f8 [8];
  stringstream sunNumberString;
  ostream local_8e8 [376];
  string local_770;
  int local_74c;
  int local_748;
  int local_744;
  undefined1 local_740 [4];
  int i;
  stringstream local_720 [8];
  stringstream levelString;
  ostream local_710 [376];
  string local_598;
  stringstream local_578 [8];
  stringstream scoreString;
  ostream local_568 [376];
  string local_3f0;
  stringstream local_3d0 [8];
  stringstream sunsString;
  ostream local_3c0 [376];
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_198 [8];
  stringstream stateString;
  ostream local_188 [376];
  StateScene *local_10;
  StateScene *this_local;
  
  local_10 = this;
  drawRect(this->x,this->y,this->w,this->h,0x19);
  std::__cxx11::stringstream::stringstream(local_198);
  switch(this->state) {
  case 0:
    std::operator<<(local_188,"NORMAL");
    iVar1 = this->x;
    iVar2 = this->y;
    std::__cxx11::stringstream::str();
    drawText(iVar1 + 2,iVar2 + 1,&local_1c8,0,0xf);
    std::__cxx11::string::~string((string *)&local_1c8);
    break;
  case 1:
    std::operator<<(local_188,"PLANT");
    iVar1 = this->x;
    iVar2 = this->y;
    std::__cxx11::stringstream::str();
    drawText(iVar1 + 2,iVar2 + 1,&local_208,0x22,0xf);
    std::__cxx11::string::~string((string *)&local_208);
    break;
  case 2:
    std::operator<<(local_188,"REMOVE");
    iVar1 = this->x;
    iVar2 = this->y;
    std::__cxx11::stringstream::str();
    drawText(iVar1 + 2,iVar2 + 1,&local_228,9,0xf);
    std::__cxx11::string::~string((string *)&local_228);
    break;
  case 4:
    std::operator<<(local_188,"PAUSE");
    iVar1 = this->x;
    iVar2 = this->y;
    std::__cxx11::stringstream::str();
    drawText(iVar1 + 2,iVar2 + 1,&local_1e8,0xb2,0xf);
    std::__cxx11::string::~string((string *)&local_1e8);
    break;
  case 5:
    std::operator<<(local_188,"GAME OVER");
    iVar1 = this->x;
    iVar2 = this->y;
    std::__cxx11::stringstream::str();
    drawText(iVar1 + 2,iVar2 + 1,&local_248,0x37,0xf);
    std::__cxx11::string::~string((string *)&local_248);
  }
  std::__cxx11::stringstream::stringstream(local_3d0);
  poVar4 = std::operator<<(local_3c0,"SUN: ");
  std::ostream::operator<<(poVar4,this->sunsNumber);
  iVar1 = this->x;
  iVar2 = this->y;
  std::__cxx11::stringstream::str();
  drawText(iVar1 + 2,iVar2 + 2,&local_3f0,0xd0,0xf);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::stringstream::stringstream(local_578);
  poVar4 = std::operator<<(local_568,"SCORE: ");
  std::ostream::operator<<(poVar4,this->score);
  iVar1 = this->x;
  iVar2 = this->y;
  std::__cxx11::stringstream::str();
  drawText(iVar1 + 2,iVar2 + 3,&local_598,0x19,0xf);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::stringstream::stringstream(local_720);
  poVar4 = std::operator<<(local_710,"LEVEL: ");
  std::ostream::operator<<(poVar4,this->level);
  iVar1 = this->x;
  iVar2 = this->y;
  std::__cxx11::stringstream::str();
  drawText(iVar1 + 2,iVar2 + 4,(string *)local_740,0,0xf);
  std::__cxx11::string::~string((string *)local_740);
  drawLine(this->x + 1,this->y + 1,this->h + -2,false,0xb);
  drawLine(this->x + this->stateW,this->y + 1,this->h + -2,false,0xb);
  local_744 = this->startIndex;
  while( true ) {
    iVar1 = local_744;
    sVar5 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::size(&this->infos);
    local_748 = (int)sVar5;
    local_74c = this->startIndex + this->plantsNumber;
    piVar6 = std::min<int>(&local_748,&local_74c);
    if (*piVar6 <= iVar1) break;
    iVar1 = this->stateW;
    iVar2 = this->x;
    iVar3 = this->y;
    iVar8 = local_744 - this->startIndex;
    pvVar7 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                       (&this->infos,(long)local_744);
    std::__cxx11::string::string((string *)&local_770,(string *)pvVar7);
    pvVar7 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                       (&this->infos,(long)local_744);
    drawText(iVar8 * 7 + 2 + iVar2 + iVar1,iVar3 + 3,&local_770,0xf,pvVar7->color);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::stringstream::stringstream(local_8f8);
    pvVar7 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                       (&this->infos,(long)local_744);
    std::ostream::operator<<(local_8e8,pvVar7->needSunNumber);
    iVar1 = this->stateW;
    iVar2 = this->x;
    iVar3 = this->y;
    iVar8 = local_744 - this->startIndex;
    std::__cxx11::stringstream::str();
    drawText(iVar8 * 7 + 2 + iVar2 + iVar1,iVar3 + 4,&local_918,0xf,0xd0);
    std::__cxx11::string::~string((string *)&local_918);
    std::__cxx11::stringstream::stringstream(local_aa0);
    pvVar7 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                       (&this->infos,(long)local_744);
    std::ostream::operator<<(local_a90,pvVar7->count);
    iVar1 = this->stateW;
    iVar2 = this->x;
    iVar3 = this->y;
    iVar8 = local_744 - this->startIndex;
    std::__cxx11::stringstream::str();
    drawText(iVar8 * 7 + 2 + iVar2 + iVar1,iVar3 + 5,&local_ac0,0xf,0x1b);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::__cxx11::stringstream::~stringstream(local_aa0);
    std::__cxx11::stringstream::~stringstream(local_8f8);
    local_744 = local_744 + 1;
  }
  drawRect(this->selectIndex * 7 + 1 + this->x + this->stateW,this->y + 1,7,7,9);
  std::__cxx11::stringstream::~stringstream(local_720);
  std::__cxx11::stringstream::~stringstream(local_578);
  std::__cxx11::stringstream::~stringstream(local_3d0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void StateScene::draw(){
	drawRect(x, y, w, h, BLUE);
	std::stringstream stateString;
	switch(state){
		case STATE_NORMAL:
			stateString << "NORMAL";
			drawText(x+2, y+1, stateString.str(), BLACK, WHITE);
			break;
		case STATE_PAUSE:
			stateString << "PAUSE";
			drawText(x+2, y+1, stateString.str(), YELLOW, WHITE);
			break;
		case STATE_PLANT:
			stateString << "PLANT";
			drawText(x+2, y+1, stateString.str(), GREEN, WHITE);
			break;
		case STATE_REMOVE:
			stateString << "REMOVE";
			drawText(x+2, y+1, stateString.str(), RED, WHITE);
			break;
		case STATE_OVER:
			stateString << "GAME OVER";
			drawText(x+2, y+1, stateString.str(), PURPLE, WHITE);
			break;

	}
	std::stringstream sunsString;
	sunsString << "SUN: " << sunsNumber;
	drawText(x+2, y+2, sunsString.str(), ORANGE, WHITE);
	std::stringstream scoreString;
	scoreString << "SCORE: " << score;
	drawText(x+2, y+3, scoreString.str(), BLUE, WHITE);
	std::stringstream levelString;
	levelString << "LEVEL: " << level;
	drawText(x+2, y+4, levelString.str(), BLACK, WHITE);



	drawLine(x+1, y+1, h-2, 0, LIGHTYELLOW);	
	drawLine(x+1+stateW-1, y+1, h-2, 0, LIGHTYELLOW);	

	
	for(int i = startIndex; i < std::min((int)infos.size(), startIndex+plantsNumber); ++i){
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+3, infos[i].name, WHITE, infos[i].color);
		std::stringstream sunNumberString;
		sunNumberString << infos[i].needSunNumber;
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+4, sunNumberString.str(), WHITE, ORANGE);
		std::stringstream countString;
		countString << infos[i].count;
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+5, countString.str(), WHITE, LIGHTBLUE);
	}


	drawRect(x+1+stateW+selectIndex*BLOCKW, y+1, BLOCKW, BLOCKW, RED);
}